

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool IsWindowContentHoverable(ImGuiWindow *window,ImGuiHoveredFlags flags)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *focused_root_window;
  ImGuiContext *g;
  ImGuiHoveredFlags flags_local;
  ImGuiWindow *window_local;
  
  if ((((GImGui->NavWindow != (ImGuiWindow *)0x0) &&
       (pIVar1 = GImGui->NavWindow->RootWindow, pIVar1 != (ImGuiWindow *)0x0)) &&
      ((pIVar1->WasActive & 1U) != 0)) && (pIVar1 != window->RootWindow)) {
    if ((pIVar1->Flags & 0x8000000U) != 0) {
      return false;
    }
    if (((pIVar1->Flags & 0x4000000U) != 0) && ((flags & 8U) == 0)) {
      return false;
    }
  }
  return true;
}

Assistant:

static inline bool IsWindowContentHoverable(ImGuiWindow* window, ImGuiHoveredFlags flags)
{
    // An active popup disable hovering on other windows (apart from its own children)
    // FIXME-OPT: This could be cached/stored within the window.
    ImGuiContext& g = *GImGui;
    if (g.NavWindow)
        if (ImGuiWindow* focused_root_window = g.NavWindow->RootWindow)
            if (focused_root_window->WasActive && focused_root_window != window->RootWindow)
            {
                // For the purpose of those flags we differentiate "standard popup" from "modal popup"
                // NB: The order of those two tests is important because Modal windows are also Popups.
                if (focused_root_window->Flags & ImGuiWindowFlags_Modal)
                    return false;
                if ((focused_root_window->Flags & ImGuiWindowFlags_Popup) && !(flags & ImGuiHoveredFlags_AllowWhenBlockedByPopup))
                    return false;
            }
    return true;
}